

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::setLayout(QFormLayout *this,int row,ItemRole role,QLayout *layout)

{
  QFormLayoutPrivate *this_00;
  int row_00;
  QFormLayoutPrivate *d;
  
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  row_00 = (int)((ulong)(this_00->m_matrix).m_storage.d.size >> 1);
  if (row_00 <= row) {
    QFormLayoutPrivate::insertRows(this_00,row_00,(row - row_00) + 1);
  }
  QFormLayoutPrivate::setLayout(this_00,row,role,layout);
  return;
}

Assistant:

void QFormLayout::setLayout(int row, ItemRole role, QLayout *layout)
{
    Q_D(QFormLayout);
    int rowCnt = rowCount();
    if (row >= rowCnt)
        d->insertRows(rowCnt, row - rowCnt + 1);
    d->setLayout(row, role, layout);
}